

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi__context *s_00;
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  stbi__uint32 sVar4;
  uint uVar5;
  void *pvVar6;
  uint local_40;
  int c;
  int v_max;
  int h_max;
  int q;
  int i;
  int p;
  int Lf;
  stbi__context *s;
  int scan_local;
  stbi__jpeg *z_local;
  
  s_00 = z->s;
  c = 1;
  local_40 = 1;
  iVar3 = stbi__get16be(s_00);
  if (iVar3 < 0xb) {
    z_local._4_4_ = stbi__err("Corrupt JPEG");
  }
  else {
    sVar1 = stbi__get8(s_00);
    if (sVar1 == '\b') {
      sVar4 = stbi__get16be(s_00);
      s_00->img_y = sVar4;
      if (s_00->img_y == 0) {
        z_local._4_4_ = stbi__err("JPEG format not supported: delayed height");
      }
      else {
        sVar4 = stbi__get16be(s_00);
        s_00->img_x = sVar4;
        if (s_00->img_x == 0) {
          z_local._4_4_ = stbi__err("Corrupt JPEG");
        }
        else {
          bVar2 = stbi__get8(s_00);
          uVar5 = (uint)bVar2;
          if (((uVar5 == 3) || (uVar5 == 1)) || (uVar5 == 4)) {
            s_00->img_n = uVar5;
            for (h_max = 0; h_max < (int)uVar5; h_max = h_max + 1) {
              z->img_comp[h_max].data = (stbi_uc *)0x0;
              z->img_comp[h_max].linebuf = (stbi_uc *)0x0;
            }
            if (iVar3 == s_00->img_n * 3 + 8) {
              z->rgb = 0;
              for (h_max = 0; h_max < s_00->img_n; h_max = h_max + 1) {
                bVar2 = stbi__get8(s_00);
                z->img_comp[h_max].id = (uint)bVar2;
                if ((s_00->img_n == 3) && (z->img_comp[h_max].id == (uint)"RGB"[h_max])) {
                  z->rgb = z->rgb + 1;
                }
                bVar2 = stbi__get8(s_00);
                z->img_comp[h_max].h = (int)(uint)bVar2 >> 4;
                if ((z->img_comp[h_max].h == 0) || (4 < z->img_comp[h_max].h)) {
                  iVar3 = stbi__err("Corrupt JPEG");
                  return iVar3;
                }
                z->img_comp[h_max].v = bVar2 & 0xf;
                if ((z->img_comp[h_max].v == 0) || (4 < z->img_comp[h_max].v)) {
                  iVar3 = stbi__err("Corrupt JPEG");
                  return iVar3;
                }
                bVar2 = stbi__get8(s_00);
                z->img_comp[h_max].tq = (uint)bVar2;
                if (3 < z->img_comp[h_max].tq) {
                  iVar3 = stbi__err("Corrupt JPEG");
                  return iVar3;
                }
              }
              if (scan == 0) {
                iVar3 = stbi__mad3sizes_valid(s_00->img_x,s_00->img_y,s_00->img_n,0);
                if (iVar3 == 0) {
                  z_local._4_4_ = stbi__err("Image too large to decode");
                }
                else {
                  for (h_max = 0; h_max < s_00->img_n; h_max = h_max + 1) {
                    if (c < z->img_comp[h_max].h) {
                      c = z->img_comp[h_max].h;
                    }
                    if ((int)local_40 < z->img_comp[h_max].v) {
                      local_40 = z->img_comp[h_max].v;
                    }
                  }
                  z->img_h_max = c;
                  z->img_v_max = local_40;
                  z->img_mcu_w = c << 3;
                  z->img_mcu_h = local_40 << 3;
                  z->img_mcu_x = ((s_00->img_x + z->img_mcu_w) - 1) / (uint)z->img_mcu_w;
                  z->img_mcu_y = ((s_00->img_y + z->img_mcu_h) - 1) / (uint)z->img_mcu_h;
                  for (h_max = 0; h_max < s_00->img_n; h_max = h_max + 1) {
                    z->img_comp[h_max].x = ((s_00->img_x * z->img_comp[h_max].h + c) - 1) / (uint)c;
                    z->img_comp[h_max].y =
                         ((s_00->img_y * z->img_comp[h_max].v + local_40) - 1) / local_40;
                    z->img_comp[h_max].w2 = z->img_mcu_x * z->img_comp[h_max].h * 8;
                    z->img_comp[h_max].h2 = z->img_mcu_y * z->img_comp[h_max].v * 8;
                    z->img_comp[h_max].coeff = (short *)0x0;
                    z->img_comp[h_max].raw_coeff = (void *)0x0;
                    z->img_comp[h_max].linebuf = (stbi_uc *)0x0;
                    pvVar6 = stbi__malloc_mad2(z->img_comp[h_max].w2,z->img_comp[h_max].h2,0xf);
                    z->img_comp[h_max].raw_data = pvVar6;
                    if (z->img_comp[h_max].raw_data == (void *)0x0) {
                      iVar3 = stbi__err("Out of memory");
                      iVar3 = stbi__free_jpeg_components(z,h_max + 1,iVar3);
                      return iVar3;
                    }
                    z->img_comp[h_max].data =
                         (stbi_uc *)((long)z->img_comp[h_max].raw_data + 0xfU & 0xfffffffffffffff0);
                    if (z->progressive != 0) {
                      z->img_comp[h_max].coeff_w = z->img_comp[h_max].w2 / 8;
                      z->img_comp[h_max].coeff_h = z->img_comp[h_max].h2 / 8;
                      pvVar6 = stbi__malloc_mad3(z->img_comp[h_max].w2,z->img_comp[h_max].h2,2,0xf);
                      z->img_comp[h_max].raw_coeff = pvVar6;
                      if (z->img_comp[h_max].raw_coeff == (void *)0x0) {
                        iVar3 = stbi__err("Out of memory");
                        iVar3 = stbi__free_jpeg_components(z,h_max + 1,iVar3);
                        return iVar3;
                      }
                      z->img_comp[h_max].coeff =
                           (short *)((long)z->img_comp[h_max].raw_coeff + 0xfU & 0xfffffffffffffff0)
                      ;
                    }
                  }
                  z_local._4_4_ = 1;
                }
              }
              else {
                z_local._4_4_ = 1;
              }
            }
            else {
              z_local._4_4_ = stbi__err("Corrupt JPEG");
            }
          }
          else {
            z_local._4_4_ = stbi__err("Corrupt JPEG");
          }
        }
      }
    }
    else {
      z_local._4_4_ = stbi__err("JPEG format not supported: 8-bit only");
    }
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}